

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBuffer::EnsureWritableBytes(ByteBuffer *this,size_t min_writable_bytes)

{
  size_t sVar1;
  overflow_error *this_00;
  uchar *__dest;
  uchar *copy_buff;
  size_t min_new_capacity;
  size_t new_capacity;
  size_t min_writable_bytes_local;
  ByteBuffer *this_local;
  
  CompactIfNeededToWriteBytes(this,min_writable_bytes);
  sVar1 = AvailableToWrite(this);
  if (sVar1 < min_writable_bytes) {
    if (this->capacity_ == 0) {
      min_new_capacity = 1;
    }
    else {
      min_new_capacity = this->capacity_;
    }
    while (min_new_capacity < this->writer_index_ + min_writable_bytes) {
      min_new_capacity = min_new_capacity << 1;
      if (min_new_capacity == 0) {
        this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(this_00,"Error: size exceeded 2GB");
        __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
      }
    }
    __dest = (uchar *)operator_new__(min_new_capacity);
    memcpy(__dest,this->buf_,this->writer_index_);
    if (this->buf_ != (uchar *)0x0) {
      operator_delete(this->buf_,1);
    }
    this->buf_ = __dest;
    this->capacity_ = min_new_capacity;
  }
  return;
}

Assistant:

void ByteBuffer::EnsureWritableBytes(size_t min_writable_bytes)
{
    CompactIfNeededToWriteBytes(min_writable_bytes);
    if (min_writable_bytes <= AvailableToWrite())
    {
        return;
    }

    size_t new_capacity;
    if (capacity_ == 0)
    {
        new_capacity = 1;
    }
    else
    {
        new_capacity = capacity_;
    }

    size_t min_new_capacity = writer_index_ + min_writable_bytes;
    while (new_capacity < min_new_capacity)
    {
        new_capacity <<= 1;
        if (new_capacity == 0) { throw std::overflow_error("Error: size exceeded 2GB"); }
    }

    unsigned char* copy_buff = new unsigned char[new_capacity];
    std::memcpy(copy_buff, buf_, writer_index_);
    delete(buf_);
    buf_ = copy_buff;
    capacity_ = new_capacity;
}